

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O1

Vector2i sf::priv::InputImpl::getMousePosition(Window *relativeTo)

{
  WindowHandle WVar1;
  Display *display;
  Vector2i VVar2;
  int y;
  int x;
  uint buttons;
  int gy;
  int gx;
  Window child;
  Window root;
  
  WVar1 = Window::getSystemHandle(relativeTo);
  VVar2.x = 0;
  VVar2.y = 0;
  if (WVar1 != 0) {
    display = OpenDisplay();
    x = 0;
    y = 0;
    XQueryPointer(display,WVar1,&root,&child,&gx,&gy,&x,&y,&buttons);
    CloseDisplay(display);
    VVar2.y = y;
    VVar2.x = x;
  }
  return VVar2;
}

Assistant:

Vector2i InputImpl::getMousePosition(const Window& relativeTo)
{
    WindowHandle handle = relativeTo.getSystemHandle();
    if (handle)
    {
        // Open a connection with the X server
        Display* display = OpenDisplay();

        // we don't care about these but they are required
        ::Window root, child;
        int gx, gy;
        unsigned int buttons;

        int x = 0;
        int y = 0;
        XQueryPointer(display, handle, &root, &child, &gx, &gy, &x, &y, &buttons);

        // Close the connection with the X server
        CloseDisplay(display);

        return Vector2i(x, y);
    }
    else
    {
        return Vector2i();
    }
}